

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpparser.c
# Opt level: O0

parse_status_t parser_parse_headers(http_parser_t *parser)

{
  char cVar1;
  size_t sVar2;
  parse_status_t pVar3;
  int iVar4;
  int iVar5;
  undefined8 *item;
  ListNode *pLVar6;
  int ret2;
  char save_char;
  http_header_t *orig_header;
  int index;
  int ret;
  int header_id;
  http_header_t *header;
  size_t save_pos;
  scanner_t *scanner;
  char *pcStack_40;
  token_type_t tok_type;
  memptr hdr_value;
  memptr token;
  parse_status_t status;
  http_parser_t *parser_local;
  
  if ((parser->position != POS_HEADERS) && (parser->ent_position != 6)) {
    __assert_fail("parser->position == (parser_pos_t)POS_HEADERS || parser->ent_position == ENTREAD_CHUNKY_HEADERS"
                  ,".upnp/src/genlib/net/http/httpparser.c",0x5c8,
                  "parse_status_t parser_parse_headers(http_parser_t *)");
  }
  while( true ) {
    while( true ) {
      sVar2 = (parser->scanner).cursor;
      pVar3 = scanner_get_token(&parser->scanner,(memptr *)&hdr_value.length,
                                (token_type_t *)((long)&scanner + 4));
      if (pVar3 != PARSE_OK) {
        (parser->scanner).cursor = sVar2;
        return pVar3;
      }
      if (scanner._4_4_ != 0) {
        if (scanner._4_4_ != 2) {
          return PARSE_FAILURE;
        }
        if (((parser->msg).is_request != 0) && ((parser->msg).method == HTTPMETHOD_POST)) {
          parser->position = POS_COMPLETE;
          return PARSE_SUCCESS;
        }
        parser->position = POS_ENTITY;
        return PARSE_OK;
      }
      pVar3 = match(&parser->scanner," : %R%c",&stack0xffffffffffffffc0);
      if (pVar3 != PARSE_OK) {
        (parser->scanner).cursor = sVar2;
        return pVar3;
      }
      iVar4 = map_str_to_int((char *)hdr_value.length,(size_t)token.buf,Http_Header_Names,0x21,0);
      if (iVar4 == -1) {
        index = -1;
        cVar1 = token.buf[hdr_value.length];
        token.buf[hdr_value.length] = '\0';
        _ret2 = httpmsg_find_hdr_str(&parser->msg,(char *)hdr_value.length);
        token.buf[hdr_value.length] = cVar1;
      }
      else {
        if (Http_Header_Names[iVar4].id == 0x13) {
          (parser->msg).method = SOAPMETHOD_POST;
        }
        index = Http_Header_Names[iVar4].id;
        _ret2 = httpmsg_find_hdr(&parser->msg,index,(memptr *)0x0);
      }
      if (_ret2 == (http_header_t *)0x0) break;
      if (hdr_value.buf != (char *)0x0) {
        iVar4 = membuffer_append_str(&_ret2->value,", ");
        iVar5 = membuffer_append(&_ret2->value,pcStack_40,(size_t)hdr_value.buf);
        if ((iVar4 == -0x68) || (iVar5 == -0x68)) {
          parser->http_error_code = 500;
          return PARSE_FAILURE;
        }
      }
    }
    item = (undefined8 *)malloc(0x58);
    if (item == (undefined8 *)0x0) {
      parser->http_error_code = 500;
      return PARSE_FAILURE;
    }
    membuffer_init((membuffer *)(item + 7));
    membuffer_init((membuffer *)(item + 3));
    if (hdr_value.buf == (char *)0x0) {
      pcStack_40 = &parser_parse_headers::zero;
      hdr_value.buf = (char *)0x1;
    }
    iVar4 = membuffer_assign((membuffer *)(item + 7),(void *)hdr_value.length,(size_t)token.buf);
    if ((iVar4 != 0) ||
       (iVar4 = membuffer_assign((membuffer *)(item + 3),pcStack_40,(size_t)hdr_value.buf),
       iVar4 != 0)) break;
    *item = item[7];
    item[1] = item[8];
    *(int *)(item + 2) = index;
    pLVar6 = ListAddTail(&(parser->msg).headers,item);
    if (pLVar6 == (ListNode *)0x0) {
      membuffer_destroy((membuffer *)(item + 3));
      membuffer_destroy((membuffer *)(item + 7));
      free(item);
      parser->http_error_code = 500;
      return PARSE_FAILURE;
    }
  }
  membuffer_destroy((membuffer *)(item + 3));
  membuffer_destroy((membuffer *)(item + 7));
  free(item);
  parser->http_error_code = 500;
  return PARSE_FAILURE;
}

Assistant:

parse_status_t parser_parse_headers(http_parser_t *parser)
{
	parse_status_t status;
	memptr token;
	memptr hdr_value;
	token_type_t tok_type;
	scanner_t *scanner = &parser->scanner;
	size_t save_pos;
	http_header_t *header;
	int header_id;
	int ret = 0;
	int index;
	http_header_t *orig_header;
	char save_char;
	int ret2;
	static char zero = 0;

	assert(parser->position == (parser_pos_t)POS_HEADERS ||
		parser->ent_position == ENTREAD_CHUNKY_HEADERS);

	while (1) {
		save_pos = scanner->cursor;
		/* check end of headers */
		status = scanner_get_token(scanner, &token, &tok_type);
		if (status != (parse_status_t)PARSE_OK) {
			/* pushback tokens; useful only on INCOMPLETE error */
			scanner->cursor = save_pos;
			return status;
		}
		switch (tok_type) {
		case TT_CRLF:
			/* end of headers */
			if ((parser->msg.is_request) &&
				(parser->msg.method ==
					(http_method_t)HTTPMETHOD_POST)) {
				parser->position =
					POS_COMPLETE; /*post entity parsing */
				/*is handled separately  */
				return PARSE_SUCCESS;
			}
			parser->position = POS_ENTITY; /* read entity next */
			return PARSE_OK;
		case TT_IDENTIFIER:
			/* not end; read header */
			break;
		default:
			return PARSE_FAILURE; /* didn't see header name */
		}
		status = match(scanner, " : %R%c", &hdr_value);
		if (status != (parse_status_t)PARSE_OK) {
			/* pushback tokens; useful only on INCOMPLETE error */
			scanner->cursor = save_pos;
			return status;
		}
		/* add header */
		/* find header */
		index = map_str_to_int(token.buf,
			token.length,
			Http_Header_Names,
			NUM_HTTP_HEADER_NAMES,
			0);
		if (index != -1) {
			/*Check if it is a soap header */
			if (Http_Header_Names[index].id == HDR_SOAPACTION) {
				parser->msg.method = SOAPMETHOD_POST;
			}
			header_id = Http_Header_Names[index].id;
			orig_header =
				httpmsg_find_hdr(&parser->msg, header_id, NULL);
		} else {
			header_id = HDR_UNKNOWN;
			save_char = token.buf[token.length];
			token.buf[token.length] = '\0';
			orig_header =
				httpmsg_find_hdr_str(&parser->msg, token.buf);
			token.buf[token.length] = save_char; /* restore */
		}
		if (orig_header == NULL) {
			/* add new header */
			header = (http_header_t *)malloc(sizeof(http_header_t));
			if (header == NULL) {
				parser->http_error_code =
					HTTP_INTERNAL_SERVER_ERROR;
				return PARSE_FAILURE;
			}
			membuffer_init(&header->name_buf);
			membuffer_init(&header->value);
			/* value can be 0 length */
			if (hdr_value.length == (size_t)0) {
				hdr_value.buf = &zero;
				hdr_value.length = (size_t)1;
			}
			/* save in header in buffers */
			if (membuffer_assign(&header->name_buf,
				    token.buf,
				    token.length) ||
				membuffer_assign(&header->value,
					hdr_value.buf,
					hdr_value.length)) {
				/* not enough mem */
				membuffer_destroy(&header->value);
				membuffer_destroy(&header->name_buf);
				free(header);
				parser->http_error_code =
					HTTP_INTERNAL_SERVER_ERROR;
				return PARSE_FAILURE;
			}
			header->name.buf = header->name_buf.buf;
			header->name.length = header->name_buf.length;
			header->name_id = header_id;
			if (!ListAddTail(&parser->msg.headers, header)) {
				membuffer_destroy(&header->value);
				membuffer_destroy(&header->name_buf);
				free(header);
				parser->http_error_code =
					HTTP_INTERNAL_SERVER_ERROR;
				return PARSE_FAILURE;
			}
		} else if (hdr_value.length > (size_t)0) {
			/* append value to existing header */
			/* append space */
			ret = membuffer_append_str(&orig_header->value, ", ");
			/* append continuation of header value */
			ret2 = membuffer_append(&orig_header->value,
				hdr_value.buf,
				hdr_value.length);
			if (ret == UPNP_E_OUTOF_MEMORY ||
				ret2 == UPNP_E_OUTOF_MEMORY) {
				/* not enuf mem */
				parser->http_error_code =
					HTTP_INTERNAL_SERVER_ERROR;
				return PARSE_FAILURE;
			}
		}
	} /* end while */
}